

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rule_builder.cpp
# Opt level: O0

int __thiscall
ccs::RuleBuilder::Impl::select
          (Impl *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  Child *this_00;
  undefined4 in_register_00000034;
  enable_shared_from_this<ccs::RuleBuilder::Impl> local_38;
  fd_set *local_28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *values_local;
  string *name_local;
  Impl *this_local;
  
  name_local = (string *)CONCAT44(in_register_00000034,__nfds);
  local_28 = __writefds;
  values_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)__readfds;
  this_local = this;
  this_00 = (Child *)operator_new(0x30);
  std::enable_shared_from_this<ccs::RuleBuilder::Impl>::shared_from_this(&local_38);
  Child::Child(this_00,(shared_ptr<ccs::RuleBuilder::Impl> *)&local_38,(string *)values_local,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_28);
  std::shared_ptr<ccs::RuleBuilder::Impl>::shared_ptr<ccs::RuleBuilder::Child,void>
            ((shared_ptr<ccs::RuleBuilder::Impl> *)this,this_00);
  std::shared_ptr<ccs::RuleBuilder::Impl>::~shared_ptr
            ((shared_ptr<ccs::RuleBuilder::Impl> *)&local_38);
  return (int)this;
}

Assistant:

std::shared_ptr<RuleBuilder::Impl> RuleBuilder::Impl::select(
    const std::string &name, const std::vector<std::string> &values) {
  return std::shared_ptr<Impl>(new Child(shared_from_this(), name, values));
}